

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_net.cpp
# Opt level: O2

void RunScript(BYTE **stream,APlayerPawn *pawn,int snum,int argn,int always)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  int arg [4];
  
  arg[0] = 0;
  arg[1] = 0;
  arg[2] = 0;
  arg[3] = 0;
  uVar3 = 0;
  uVar2 = 0;
  if (0 < argn) {
    uVar2 = (ulong)(uint)argn;
  }
  for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
    iVar1 = ReadLong(stream);
    if (uVar3 < 4) {
      arg[uVar3] = iVar1;
    }
  }
  iVar1 = 4;
  if (argn < 4) {
    iVar1 = argn;
  }
  P_StartScript(&pawn->super_AActor,(line_t *)0x0,snum,level.MapName.Chars,arg,iVar1,always | 8);
  return;
}

Assistant:

static void RunScript(BYTE **stream, APlayerPawn *pawn, int snum, int argn, int always)
{
	int arg[4] = { 0, 0, 0, 0 };
	int i;
	
	for (i = 0; i < argn; ++i)
	{
		int argval = ReadLong(stream);
		if ((unsigned)i < countof(arg))
		{
			arg[i] = argval;
		}
	}
	P_StartScript(pawn, NULL, snum, level.MapName, arg, MIN<int>(countof(arg), argn), ACS_NET | always);
}